

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::
insert<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::const_iterator>
          (Map<google::protobuf::MapKey,google::protobuf::MapValueRef> *this,const_iterator first,
          const_iterator last)

{
  Node *pNVar1;
  value_type *pvVar2;
  iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
  local_58;
  iterator local_40;
  
  local_58.bucket_index_ = first.it_.bucket_index_;
  local_58.node_ = first.it_.node_;
  local_58.m_ = first.it_.m_;
  while (local_58.node_ != last.it_.node_) {
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
    find<google::protobuf::MapKey>(&local_40,(InnerMap *)this,(MapKey *)local_58.node_);
    pNVar1 = local_58.node_;
    if (local_40.node_ == (Node *)0x0) {
      pvVar2 = InnerMap::operator[]<google::protobuf::MapKey_const&>
                         ((InnerMap *)this,(MapKey *)local_58.node_);
      *(undefined8 *)(pvVar2 + 0x28) = *(undefined8 *)&pNVar1->field_0x28;
      *(undefined4 *)(pvVar2 + 0x30) = *(undefined4 *)&pNVar1->field_0x30;
    }
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
    iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
    ::operator++(&local_58);
  }
  return;
}

Assistant:

void insert(InputIt first, InputIt last) {
    for (InputIt it = first; it != last; ++it) {
      iterator exist_it = find(it->first);
      if (exist_it == end()) {
        operator[](it->first) = it->second;
      }
    }
  }